

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool *bufPool)

{
  void *__ptr;
  ZSTD_freeFunction UNRECOVERED_JUMPTABLE;
  buffer_t *pbVar1;
  ulong uVar2;
  
  if (bufPool == (ZSTDMT_bufferPool *)0x0) {
    return;
  }
  if (bufPool->totalBuffers != 0) {
    pbVar1 = bufPool->bTable;
    uVar2 = 0;
    do {
      __ptr = pbVar1->start;
      if (__ptr != (void *)0x0) {
        UNRECOVERED_JUMPTABLE = (bufPool->cMem).customFree;
        if (UNRECOVERED_JUMPTABLE == (ZSTD_freeFunction)0x0) {
          free(__ptr);
        }
        else {
          (*UNRECOVERED_JUMPTABLE)((bufPool->cMem).opaque,__ptr);
        }
      }
      uVar2 = uVar2 + 1;
      pbVar1 = pbVar1 + 1;
    } while (uVar2 < bufPool->totalBuffers);
  }
  pthread_mutex_destroy((pthread_mutex_t *)bufPool);
  UNRECOVERED_JUMPTABLE = (bufPool->cMem).customFree;
  if (UNRECOVERED_JUMPTABLE != (ZSTD_freeFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)((bufPool->cMem).opaque,bufPool);
    return;
  }
  free(bufPool);
  return;
}

Assistant:

static void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool* bufPool)
{
    unsigned u;
    DEBUGLOG(3, "ZSTDMT_freeBufferPool (address:%08X)", (U32)(size_t)bufPool);
    if (!bufPool) return;   /* compatibility with free on NULL */
    for (u=0; u<bufPool->totalBuffers; u++) {
        DEBUGLOG(4, "free buffer %2u (address:%08X)", u, (U32)(size_t)bufPool->bTable[u].start);
        ZSTD_customFree(bufPool->bTable[u].start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_destroy(&bufPool->poolMutex);
    ZSTD_customFree(bufPool, bufPool->cMem);
}